

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  void *in_RDI;
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe *in_stack_00000178;
  secp256k1_fe *in_stack_00000180;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  secp256k1_fe_verify(in_RSI);
  memcpy(in_RDI,in_RSI,0x28);
  secp256k1_fe_impl_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x119b3f);
  *(undefined4 *)((long)in_RDI + 0x50) = 0;
  secp256k1_fe_impl_add_int((secp256k1_fe *)&stack0xffffffffffffffa0,7);
  iVar1 = secp256k1_fe_sqrt(in_stack_00000180,in_stack_00000178);
  return iVar1;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    secp256k1_fe_verify(x);
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_sqrt(&r->y, &x3);
}